

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::StaleFileRemovalCommand::getVerboseDescription
          (StaleFileRemovalCommand *this,SmallVectorImpl<char> *result)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileToDelete;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  raw_svector_ostream local_60;
  
  computeFilesToDelete(this);
  (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[3])(this,result);
  llvm::raw_svector_ostream::raw_svector_ostream(&local_60,result);
  llvm::raw_ostream::operator<<((raw_ostream *)&local_60,", stale files: [");
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_60);
  pbVar1 = (this->filesToDelete).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->filesToDelete).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string((string *)&local_80,(string *)pbVar3);
    llvm::raw_svector_ostream::raw_svector_ostream(&local_60,result);
    llvm::raw_ostream::operator<<((raw_ostream *)&local_60,&local_80);
    llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_60);
    bVar2 = std::operator!=(&local_80,
                            (this->filesToDelete).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
    if (bVar2) {
      llvm::raw_svector_ostream::raw_svector_ostream(&local_60,result);
      llvm::raw_ostream::operator<<((raw_ostream *)&local_60,", ");
      llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_60);
    }
    std::__cxx11::string::_M_dispose();
  }
  llvm::raw_svector_ostream::raw_svector_ostream(&local_60,result);
  llvm::raw_ostream::operator<<((raw_ostream *)&local_60,"], roots: [");
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_60);
  pbVar1 = (this->roots).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->roots).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string((string *)&local_80,(string *)pbVar3);
    llvm::raw_svector_ostream::raw_svector_ostream(&local_60,result);
    llvm::raw_ostream::operator<<((raw_ostream *)&local_60,&local_80);
    llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_60);
    bVar2 = std::operator!=(&local_80,
                            (this->roots).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
    if (bVar2) {
      llvm::raw_svector_ostream::raw_svector_ostream(&local_60,result);
      llvm::raw_ostream::operator<<((raw_ostream *)&local_60,", ");
      llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_60);
    }
    std::__cxx11::string::_M_dispose();
  }
  llvm::raw_svector_ostream::raw_svector_ostream(&local_60,result);
  llvm::raw_ostream::operator<<((raw_ostream *)&local_60,"]");
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_60);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    computeFilesToDelete();

    getShortDescription(result);
    llvm::raw_svector_ostream(result) << ", stale files: [";
    for (auto fileToDelete : filesToDelete) {
      llvm::raw_svector_ostream(result) << fileToDelete;
      if (fileToDelete != *(--filesToDelete.end())) {
        llvm::raw_svector_ostream(result) << ", ";
      }
    }
    llvm::raw_svector_ostream(result) << "], roots: [";
    for (auto root : roots) {
      llvm::raw_svector_ostream(result) << root;
      if (root != *(--roots.end())) {
        llvm::raw_svector_ostream(result) << ", ";
      }
    }
    llvm::raw_svector_ostream(result) << "]";
  }